

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::ConsoleAssertionPrinter::printReconstructedExpression
          (ConsoleAssertionPrinter *this)

{
  bool bVar1;
  Column *col;
  ostream *poVar2;
  string local_68;
  Column local_48;
  Colour local_11;
  ConsoleAssertionPrinter *pCStack_10;
  Colour colourGuard;
  ConsoleAssertionPrinter *this_local;
  
  pCStack_10 = this;
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    std::operator<<((ostream *)this->stream,"with expansion:\n");
    Colour::Colour(&local_11,BrightYellow);
    poVar2 = this->stream;
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_68,this->result);
    clara::TextFlow::Column::Column(&local_48,&local_68);
    col = clara::TextFlow::Column::indent(&local_48,2);
    poVar2 = clara::TextFlow::operator<<(poVar2,col);
    std::operator<<((ostream *)poVar2,'\n');
    clara::TextFlow::Column::~Column(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    Colour::~Colour(&local_11);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
        if (result.hasExpandedExpression()) {
            stream << "with expansion:\n";
            Colour colourGuard(Colour::ReconstructedExpression);
            stream << Column(result.getExpandedExpression()).indent(2) << '\n';
        }
    }